

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void add_qemu_ldst_label(TCGContext_conflict9 *s,_Bool is_ld,_Bool is_64,TCGMemOpIdx oi,
                        TCGReg datalo,TCGReg datahi,TCGReg addrlo,TCGReg addrhi,tcg_insn_unit *raddr
                        ,tcg_insn_unit **label_ptr)

{
  TCGLabelQemuLdst *pTVar1;
  undefined8 *puVar2;
  tcg_insn_unit *ptVar3;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000014;
  
  puVar2 = (undefined8 *)CONCAT44(in_stack_00000014,addrhi);
  ptVar3 = (tcg_insn_unit *)CONCAT44(in_stack_0000000c,addrlo);
  pTVar1 = (TCGLabelQemuLdst *)s->pool_cur;
  if ((TCGLabelQemuLdst *)s->pool_end < pTVar1 + 1) {
    pTVar1 = (TCGLabelQemuLdst *)tcg_malloc_internal_tricore(s,0x40);
    ptVar3 = (tcg_insn_unit *)CONCAT44(in_stack_0000000c,addrlo);
    puVar2 = (undefined8 *)CONCAT44(in_stack_00000014,addrhi);
  }
  else {
    s->pool_cur = &pTVar1[1].is_ld;
  }
  (pTVar1->next).sqe_next = (TCGLabelQemuLdst *)0x0;
  *(s->ldst_labels).sqh_last = pTVar1;
  (s->ldst_labels).sqh_last = &(pTVar1->next).sqe_next;
  pTVar1->is_ld = is_ld;
  pTVar1->oi = oi;
  pTVar1->type = (uint)is_64;
  pTVar1->datalo_reg = datalo;
  pTVar1->datahi_reg = TCG_REG_EAX;
  pTVar1->addrlo_reg = datahi;
  pTVar1->addrhi_reg = TCG_REG_EAX;
  pTVar1->raddr = ptVar3;
  pTVar1->label_ptr[0] = (tcg_insn_unit *)*puVar2;
  return;
}

Assistant:

static void add_qemu_ldst_label(TCGContext *s, bool is_ld, bool is_64,
                                TCGMemOpIdx oi,
                                TCGReg datalo, TCGReg datahi,
                                TCGReg addrlo, TCGReg addrhi,
                                tcg_insn_unit *raddr,
                                tcg_insn_unit **label_ptr)
{
    TCGLabelQemuLdst *label = new_ldst_label(s);

    label->is_ld = is_ld;
    label->oi = oi;
    label->type = is_64 ? TCG_TYPE_I64 : TCG_TYPE_I32;
    label->datalo_reg = datalo;
    label->datahi_reg = datahi;
    label->addrlo_reg = addrlo;
    label->addrhi_reg = addrhi;
    label->raddr = raddr;
    label->label_ptr[0] = label_ptr[0];
    if (TARGET_LONG_BITS > TCG_TARGET_REG_BITS) {
        label->label_ptr[1] = label_ptr[1];
    }
}